

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptor::CopyJsonNameTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  LogMessage *other;
  long lVar1;
  long lVar2;
  LogFinisher local_59;
  LogMessage local_58;
  
  if ((*(int *)(this + 0x2c) == (proto->message_type_).super_RepeatedPtrFieldBase.current_size_) &&
     (*(int *)(this + 0x38) == (proto->extension_).super_RepeatedPtrFieldBase.current_size_)) {
    if (0 < *(int *)(this + 0x2c)) {
      lVar2 = 0;
      lVar1 = 0;
      do {
        Descriptor::CopyJsonNameTo
                  ((Descriptor *)(*(long *)(this + 0x68) + lVar2),
                   (DescriptorProto *)
                   ((proto->message_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar1]);
        lVar1 = lVar1 + 1;
        lVar2 = lVar2 + 0x90;
      } while (lVar1 < *(int *)(this + 0x2c));
    }
    if (0 < *(int *)(this + 0x38)) {
      lVar2 = 0;
      lVar1 = 0;
      do {
        FieldDescriptor::CopyJsonNameTo
                  ((FieldDescriptor *)(*(long *)(this + 0x80) + lVar2),
                   (FieldDescriptorProto *)
                   ((proto->extension_).super_RepeatedPtrFieldBase.rep_)->elements[lVar1]);
        lVar1 = lVar1 + 1;
        lVar2 = lVar2 + 0x98;
      } while (lVar1 < *(int *)(this + 0x38));
    }
  }
  else {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x7ed);
    other = internal::LogMessage::operator<<
                      (&local_58,"Cannot copy json_name to a proto of a different size.");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  return;
}

Assistant:

void FileDescriptor::CopyTo(FileDescriptorProto* proto) const {
  proto->set_name(name());
  if (!package().empty()) proto->set_package(package());
  // TODO(liujisi): Also populate when syntax="proto2".
  if (syntax() == SYNTAX_PROTO3) proto->set_syntax(SyntaxName(syntax()));

  for (int i = 0; i < dependency_count(); i++) {
    proto->add_dependency(dependency(i)->name());
  }

  for (int i = 0; i < public_dependency_count(); i++) {
    proto->add_public_dependency(public_dependencies_[i]);
  }

  for (int i = 0; i < weak_dependency_count(); i++) {
    proto->add_weak_dependency(weak_dependencies_[i]);
  }

  for (int i = 0; i < message_type_count(); i++) {
    message_type(i)->CopyTo(proto->add_message_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < service_count(); i++) {
    service(i)->CopyTo(proto->add_service());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }

  if (&options() != &FileOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}